

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void run_nonce_function_bip340_tests(void)

{
  int iVar1;
  size_t algolen_tmp;
  size_t msglen_tmp;
  uint32_t offset;
  uchar nonce2 [32];
  int i;
  uchar *args [5];
  uchar aux_rand [32];
  uchar pk [32];
  uchar key [32];
  size_t msglen;
  uchar msg [32];
  uchar nonce_z [32];
  uchar nonce [32];
  secp256k1_sha256 sha_optimized;
  secp256k1_sha256 sha;
  size_t algolen;
  uchar algo [13];
  uchar aux_tag [11];
  uchar tag [13];
  secp256k1_sha256 *in_stack_fffffffffffffd98;
  secp256k1_sha256 *in_stack_fffffffffffffda0;
  undefined8 uVar2;
  uint32_t range;
  size_t in_stack_fffffffffffffdb0;
  uchar *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined1 local_238 [24];
  size_t in_stack_fffffffffffffde0;
  size_t in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  int iVar3;
  undefined1 *n_flip;
  uchar **args_00;
  undefined1 local_1d8 [8];
  uchar *in_stack_fffffffffffffe30;
  uchar *in_stack_fffffffffffffe38;
  uchar *in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe48;
  uchar *in_stack_fffffffffffffe50;
  uchar *in_stack_fffffffffffffe58;
  uchar *local_198;
  size_t in_stack_fffffffffffffe70;
  void *in_stack_fffffffffffffe78;
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined1 local_128 [248];
  undefined8 local_30;
  char local_25 [37];
  
  builtin_strncpy(local_25,"BIP0340/nonceBIP0340/auxBIP0340/nonce",0x25);
  local_30 = 0xd;
  secp256k1_sha256_initialize_tagged
            ((secp256k1_sha256 *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  secp256k1_nonce_function_bip340_sha256_tagged((secp256k1_sha256 *)0x153723);
  test_sha256_eq(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  secp256k1_sha256_initialize_tagged
            ((secp256k1_sha256 *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  secp256k1_nonce_function_bip340_sha256_tagged_aux((secp256k1_sha256 *)0x15375f);
  test_sha256_eq(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  testrand256((uchar *)in_stack_fffffffffffffda0);
  testrand256((uchar *)in_stack_fffffffffffffda0);
  testrand256((uchar *)in_stack_fffffffffffffda0);
  testrand256((uchar *)in_stack_fffffffffffffda0);
  n_flip = local_168;
  args_00 = &local_198;
  for (iVar3 = 0; iVar3 < COUNT; iVar3 = iVar3 + 1) {
    nonce_function_bip340_bitflip
              (args_00,(size_t)n_flip,CONCAT44(iVar3,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    nonce_function_bip340_bitflip
              (args_00,(size_t)n_flip,CONCAT44(iVar3,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    nonce_function_bip340_bitflip
              (args_00,(size_t)n_flip,CONCAT44(iVar3,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    nonce_function_bip340_bitflip
              (args_00,(size_t)n_flip,CONCAT44(iVar3,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    nonce_function_bip340_bitflip
              (args_00,(size_t)n_flip,CONCAT44(iVar3,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    nonce_function_bip340_bitflip
              (args_00,(size_t)n_flip,CONCAT44(iVar3,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  }
  iVar3 = nonce_function_bip340
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                     in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                     in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
  if (iVar3 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x4c,
            "test condition failed: nonce_function_bip340(nonce, msg, msglen, key, pk, NULL, 0, NULL) == 0"
           );
    abort();
  }
  iVar3 = nonce_function_bip340
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                     in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                     in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
  if (iVar3 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x4d,
            "test condition failed: nonce_function_bip340(nonce, msg, msglen, key, pk, algo, algolen, NULL) == 1"
           );
    abort();
  }
  testrand_bytes_test((uchar *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                      (size_t)in_stack_fffffffffffffdb8);
  uVar2 = 0;
  iVar3 = nonce_function_bip340
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                     in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                     in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
  if (iVar3 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
            ,0x50,
            "test condition failed: nonce_function_bip340(nonce, msg, msglen, key, pk, algo, algolen, NULL) == 1"
           );
    abort();
  }
  iVar3 = 0;
  while( true ) {
    if (COUNT <= iVar3) {
      memset(local_1d8,0,0x20);
      iVar3 = nonce_function_bip340
                        (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                         in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                         in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                         in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
      if (iVar3 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
                ,0x65,
                "test condition failed: nonce_function_bip340(nonce_z, msg, msglen, key, pk, algo, algolen, &aux_rand) == 1"
               );
        abort();
      }
      iVar3 = nonce_function_bip340
                        (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                         in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                         in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                         in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
      if (iVar3 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
                ,0x66,
                "test condition failed: nonce_function_bip340(nonce, msg, msglen, key, pk, algo, algolen, NULL) == 1"
               );
        abort();
      }
      iVar3 = secp256k1_memcmp_var(local_148,local_128,0x20);
      if (iVar3 != 0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
                ,0x67,"test condition failed: secp256k1_memcmp_var(nonce_z, nonce, 32) == 0");
        abort();
      }
      return;
    }
    testrand_int((uint32_t)((ulong)uVar2 >> 0x20));
    range = 0;
    iVar1 = nonce_function_bip340
                      (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48
                       ,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                       in_stack_fffffffffffffe30,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78
                      );
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
              ,0x59,
              "test condition failed: nonce_function_bip340(nonce2, msg, msglen_tmp, key, pk, algo, algolen, NULL) == 1"
             );
      abort();
    }
    iVar1 = secp256k1_memcmp_var(local_128,local_238,0x20);
    if (iVar1 == 0) break;
    testrand_int(range);
    uVar2 = 0;
    iVar1 = nonce_function_bip340
                      (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48
                       ,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                       in_stack_fffffffffffffe30,in_stack_fffffffffffffe70,in_stack_fffffffffffffe78
                      );
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
              ,0x5f,
              "test condition failed: nonce_function_bip340(nonce2, msg, msglen, key, pk, algo, algolen_tmp, NULL) == 1"
             );
      abort();
    }
    iVar1 = secp256k1_memcmp_var(local_128,local_238,0x20);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
              ,0x60,"test condition failed: secp256k1_memcmp_var(nonce, nonce2, 32) != 0");
      abort();
    }
    iVar3 = iVar3 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
          ,0x5a,"test condition failed: secp256k1_memcmp_var(nonce, nonce2, 32) != 0");
  abort();
}

Assistant:

static void run_nonce_function_bip340_tests(void) {
    unsigned char tag[] = {'B', 'I', 'P', '0', '3', '4', '0', '/', 'n', 'o', 'n', 'c', 'e'};
    unsigned char aux_tag[] = {'B', 'I', 'P', '0', '3', '4', '0', '/', 'a', 'u', 'x'};
    unsigned char algo[] = {'B', 'I', 'P', '0', '3', '4', '0', '/', 'n', 'o', 'n', 'c', 'e'};
    size_t algolen = sizeof(algo);
    secp256k1_sha256 sha;
    secp256k1_sha256 sha_optimized;
    unsigned char nonce[32], nonce_z[32];
    unsigned char msg[32];
    size_t msglen = sizeof(msg);
    unsigned char key[32];
    unsigned char pk[32];
    unsigned char aux_rand[32];
    unsigned char *args[5];
    int i;

    /* Check that hash initialized by
     * secp256k1_nonce_function_bip340_sha256_tagged has the expected
     * state. */
    secp256k1_sha256_initialize_tagged(&sha, tag, sizeof(tag));
    secp256k1_nonce_function_bip340_sha256_tagged(&sha_optimized);
    test_sha256_eq(&sha, &sha_optimized);

   /* Check that hash initialized by
    * secp256k1_nonce_function_bip340_sha256_tagged_aux has the expected
    * state. */
    secp256k1_sha256_initialize_tagged(&sha, aux_tag, sizeof(aux_tag));
    secp256k1_nonce_function_bip340_sha256_tagged_aux(&sha_optimized);
    test_sha256_eq(&sha, &sha_optimized);

    testrand256(msg);
    testrand256(key);
    testrand256(pk);
    testrand256(aux_rand);

    /* Check that a bitflip in an argument results in different nonces. */
    args[0] = msg;
    args[1] = key;
    args[2] = pk;
    args[3] = algo;
    args[4] = aux_rand;
    for (i = 0; i < COUNT; i++) {
        nonce_function_bip340_bitflip(args, 0, 32, msglen, algolen);
        nonce_function_bip340_bitflip(args, 1, 32, msglen, algolen);
        nonce_function_bip340_bitflip(args, 2, 32, msglen, algolen);
        /* Flip algo special case "BIP0340/nonce" */
        nonce_function_bip340_bitflip(args, 3, algolen, msglen, algolen);
        /* Flip algo again */
        nonce_function_bip340_bitflip(args, 3, algolen, msglen, algolen);
        nonce_function_bip340_bitflip(args, 4, 32, msglen, algolen);
    }

    /* NULL algo is disallowed */
    CHECK(nonce_function_bip340(nonce, msg, msglen, key, pk, NULL, 0, NULL) == 0);
    CHECK(nonce_function_bip340(nonce, msg, msglen, key, pk, algo, algolen, NULL) == 1);
    /* Other algo is fine */
    testrand_bytes_test(algo, algolen);
    CHECK(nonce_function_bip340(nonce, msg, msglen, key, pk, algo, algolen, NULL) == 1);

    for (i = 0; i < COUNT; i++) {
        unsigned char nonce2[32];
        uint32_t offset = testrand_int(msglen - 1);
        size_t msglen_tmp = (msglen + offset) % msglen;
        size_t algolen_tmp;

        /* Different msglen gives different nonce */
        CHECK(nonce_function_bip340(nonce2, msg, msglen_tmp, key, pk, algo, algolen, NULL) == 1);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);

        /* Different algolen gives different nonce */
        offset = testrand_int(algolen - 1);
        algolen_tmp = (algolen + offset) % algolen;
        CHECK(nonce_function_bip340(nonce2, msg, msglen, key, pk, algo, algolen_tmp, NULL) == 1);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);
    }

    /* NULL aux_rand argument is allowed, and identical to passing all zero aux_rand. */
    memset(aux_rand, 0, 32);
    CHECK(nonce_function_bip340(nonce_z, msg, msglen, key, pk, algo, algolen, &aux_rand) == 1);
    CHECK(nonce_function_bip340(nonce, msg, msglen, key, pk, algo, algolen, NULL) == 1);
    CHECK(secp256k1_memcmp_var(nonce_z, nonce, 32) == 0);
}